

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.hpp
# Opt level: O0

void __thiscall beast::unit_test::runner::log<void>(runner *this,string *s)

{
  allocator local_41;
  string local_40;
  lock_guard<std::recursive_mutex> local_20;
  lock_guard<std::recursive_mutex> lock;
  string *s_local;
  runner *this_local;
  
  lock._M_device = (mutex_type *)s;
  ::std::lock_guard<std::recursive_mutex>::lock_guard(&local_20,(mutex_type *)&this->mutex_);
  if ((this->default_ & 1U) != 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_40,"",&local_41);
    testcase<void>(this,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  (*this->_vptr_runner[8])(this,lock._M_device);
  ::std::lock_guard<std::recursive_mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void
runner::log(std::string const& s)
{
    std::lock_guard<std::recursive_mutex> lock(mutex_);
    if(default_)
        testcase("");
    on_log(s);
}